

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuEvent>::emplace<QDBusMenuEvent_const&>
          (QMovableArrayOps<QDBusMenuEvent> *this,qsizetype i,QDBusMenuEvent *args)

{
  QDBusMenuEvent **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_a0;
  QDBusMenuEvent tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.size
        == i) {
      qVar5 = QArrayDataPointer<QDBusMenuEvent>::freeSpaceAtEnd
                        ((QArrayDataPointer<QDBusMenuEvent> *)this);
      if (qVar5 == 0) goto LAB_00594e77;
      QDBusMenuEvent::QDBusMenuEvent
                ((this->super_QGenericArrayOps<QDBusMenuEvent>).
                 super_QArrayDataPointer<QDBusMenuEvent>.ptr +
                 (this->super_QGenericArrayOps<QDBusMenuEvent>).
                 super_QArrayDataPointer<QDBusMenuEvent>.size,args);
LAB_00594f7b:
      pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).
                super_QArrayDataPointer<QDBusMenuEvent>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00594f34;
    }
LAB_00594e77:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QDBusMenuEvent>::freeSpaceAtBegin
                        ((QArrayDataPointer<QDBusMenuEvent> *)this);
      if (qVar5 != 0) {
        QDBusMenuEvent::QDBusMenuEvent
                  ((this->super_QGenericArrayOps<QDBusMenuEvent>).
                   super_QArrayDataPointer<QDBusMenuEvent>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).
                   super_QArrayDataPointer<QDBusMenuEvent>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_00594f7b;
      }
    }
  }
  tmp._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.m_data.m_variant.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.m_data.m_variant.d._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.m_data.m_variant.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_data.m_variant.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.m_eventId.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_eventId.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.m_eventId.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QDBusMenuEvent::QDBusMenuEvent(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.
          size != 0;
  QArrayDataPointer<QDBusMenuEvent>::detachAndGrow
            ((QArrayDataPointer<QDBusMenuEvent> *)this,(uint)(i == 0 && bVar6),1,
             (QDBusMenuEvent **)0x0,(QArrayDataPointer<QDBusMenuEvent> *)0x0);
  if (i == 0 && bVar6) {
    QDBusMenuEvent::QDBusMenuEvent
              ((this->super_QGenericArrayOps<QDBusMenuEvent>).
               super_QArrayDataPointer<QDBusMenuEvent>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).
               super_QArrayDataPointer<QDBusMenuEvent>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>
              .size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_a0,(QArrayDataPointer<QDBusMenuEvent> *)this,i,1);
    QDBusMenuEvent::QDBusMenuEvent(local_a0.displaceFrom,&tmp);
    local_a0.displaceFrom = local_a0.displaceFrom + 1;
    Inserter::~Inserter(&local_a0);
  }
  QDBusMenuEvent::~QDBusMenuEvent(&tmp);
LAB_00594f34:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }